

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_store_srsgpr(TCGContext_conflict6 *tcg_ctx,int from,int to)

{
  TCGv_i64 t;
  TCGv_i32 ret;
  TCGv_ptr ret_00;
  uintptr_t o;
  uintptr_t o_2;
  uintptr_t o_1;
  
  if (to != 0) {
    t = tcg_temp_new_i64(tcg_ctx);
    ret = tcg_temp_new_i32(tcg_ctx);
    ret_00 = tcg_temp_new_ptr(tcg_ctx);
    gen_load_gpr(tcg_ctx,t,from);
    tcg_gen_ld_i32(tcg_ctx,ret,tcg_ctx->cpu_env,0x694);
    tcg_gen_shri_i32_mips64el(tcg_ctx,ret,ret,6);
    tcg_gen_andi_i32_mips64el(tcg_ctx,ret,ret,0xf);
    tcg_gen_muli_i32_mips64el(tcg_ctx,ret,ret,0x100);
    tcg_gen_ext_i32_i64_mips64el(tcg_ctx,(TCGv_i64)ret_00,ret);
    tcg_gen_add_i64(tcg_ctx,(TCGv_i64)ret_00,(TCGv_i64)tcg_ctx->cpu_env,(TCGv_i64)ret_00);
    tcg_gen_st_i64_mips64el(tcg_ctx,t,ret_00,(ulong)(uint)to << 3);
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
    return;
  }
  return;
}

Assistant:

static inline void gen_store_srsgpr(TCGContext *tcg_ctx, int from, int to)
{
    if (to != 0) {
        TCGv t0 = tcg_temp_new(tcg_ctx);
        TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
        TCGv_ptr addr = tcg_temp_new_ptr(tcg_ctx);

        gen_load_gpr(tcg_ctx, t0, from);
        tcg_gen_ld_i32(tcg_ctx, t2, tcg_ctx->cpu_env, offsetof(CPUMIPSState, CP0_SRSCtl));
        tcg_gen_shri_i32(tcg_ctx, t2, t2, CP0SRSCtl_PSS);
        tcg_gen_andi_i32(tcg_ctx, t2, t2, 0xf);
        tcg_gen_muli_i32(tcg_ctx, t2, t2, sizeof(target_ulong) * 32);
        tcg_gen_ext_i32_ptr(tcg_ctx, addr, t2);
        tcg_gen_add_ptr(tcg_ctx, addr, tcg_ctx->cpu_env, addr);

        tcg_gen_st_tl(tcg_ctx, t0, addr, sizeof(target_ulong) * to);
        tcg_temp_free_ptr(tcg_ctx, addr);
        tcg_temp_free_i32(tcg_ctx, t2);
        tcg_temp_free(tcg_ctx, t0);
    }
}